

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O0

void __thiscall Logger::Impl::formatTime(Impl *this)

{
  tm *__tp;
  char *in_RDI;
  tm *p_time;
  char str_t [26];
  time_t time;
  timeval tv;
  char local_48 [40];
  __time_t local_20;
  timeval local_18;
  
  memset(local_48,0,0x1a);
  gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  local_20 = local_18.tv_sec;
  __tp = localtime(&local_20);
  strftime(local_48,0x1a,"%Y-%m-%d %H:%M:%S\n",__tp);
  LogStream::operator<<((LogStream *)__tp,in_RDI);
  return;
}

Assistant:

void Logger::Impl::formatTime(){
    struct timeval tv;
    time_t time;
    char str_t[26] = {0};
    gettimeofday(&tv, nullptr);
    time = tv.tv_sec;
    struct tm* p_time = localtime(&time);
    strftime(str_t, 26, "%Y-%m-%d %H:%M:%S\n", p_time);
    stream_<<str_t;
}